

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMaximumTwice_Test::
CommandLineInterfaceTest_EditionDefaultsInvalidMaximumTwice_Test
          (CommandLineInterfaceTest_EditionDefaultsInvalidMaximumTwice_Test *this)

{
  CommandLineInterfaceTest_EditionDefaultsInvalidMaximumTwice_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_EditionDefaultsInvalidMaximumTwice_Test_029fb888
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMaximumTwice) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_maximum=2023 "
      "--edition_defaults_maximum=2023 "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("edition_defaults_maximum may only be passed once");
}